

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int rsa_prepare_blinding
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *G;
  int iVar2;
  int iVar3;
  
  X = &ctx->Vf;
  if ((ctx->Vf).p == (mbedtls_mpi_uint *)0x0) {
    G = &ctx->Vi;
    pmVar1 = &ctx->N;
    iVar2 = 0xc;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        return -0x4480;
      }
      iVar3 = mbedtls_mpi_fill_random(X,ctx->len - 1,f_rng,p_rng);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = mbedtls_mpi_gcd(G,X,pmVar1);
      if (iVar3 != 0) {
        return iVar3;
      }
      iVar3 = mbedtls_mpi_cmp_int(G,1);
    } while (iVar3 != 0);
    iVar2 = mbedtls_mpi_inv_mod(G,X,pmVar1);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_exp_mod(G,G,&ctx->E,pmVar1,&ctx->RN);
      return iVar2;
    }
  }
  else {
    pmVar1 = &ctx->Vi;
    iVar2 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,pmVar1);
    if (iVar2 == 0) {
      iVar2 = mbedtls_mpi_mod_mpi(pmVar1,pmVar1,&ctx->N);
      if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_mul_mpi(X,X,X), iVar2 == 0)) {
        iVar2 = mbedtls_mpi_mod_mpi(X,X,&ctx->N);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

static int rsa_prepare_blinding( mbedtls_rsa_context *ctx,
                 int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, count = 0;

    if( ctx->Vf.p != NULL )
    {
        /* We already have blinding values, just update them by squaring */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vi, &ctx->Vi, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vi, &ctx->Vi, &ctx->N ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vf, &ctx->Vf, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vf, &ctx->Vf, &ctx->N ) );

        goto cleanup;
    }

    /* Unblinding value: Vf = random number, invertible mod N */
    do {
        if( count++ > 10 )
            return( MBEDTLS_ERR_RSA_RNG_FAILED );

        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &ctx->Vf, ctx->len - 1, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_gcd( &ctx->Vi, &ctx->Vf, &ctx->N ) );
    } while( mbedtls_mpi_cmp_int( &ctx->Vi, 1 ) != 0 );

    /* Blinding value: Vi =  Vf^(-e) mod N */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->Vi, &ctx->Vf, &ctx->N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->Vi, &ctx->Vi, &ctx->E, &ctx->N, &ctx->RN ) );


cleanup:
    return( ret );
}